

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O3

int ya_getopt_shortopts(int argc,char **argv,char *optstring,int long_only)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  uint __c;
  
  pcVar1 = ya_optnext;
  __c = (uint)*ya_optnext;
  pcVar2 = strchr(optstring,__c);
  if (pcVar2 == (char *)0x0) {
    ya_optarg = (char *)0x0;
    if (long_only != 0) {
      ya_getopt_error(optstring,"%s: unrecognized option \'-%s\'\n",*argv,pcVar1);
      ya_optind = ya_optind + 1;
      ya_optnext = (char *)0x0;
      return 0x3f;
    }
    ya_optopt = __c;
    ya_getopt_error(optstring,"%s: invalid option -- \'%c\'\n",*argv,(ulong)__c);
    __c = 0x3f;
    if (ya_optnext[1] != '\0') {
      ya_optnext = ya_optnext + 1;
      return 0x3f;
    }
  }
  else {
    if (pcVar2[1] != ':') {
      if (pcVar1[1] == '\0') {
        ya_optind = ya_optind + 1;
        ya_optarg = (char *)0x0;
        ya_optnext = (char *)0x0;
        return __c;
      }
      ya_optarg = (char *)0x0;
      ya_optnext = pcVar1 + 1;
      return __c;
    }
    if (pcVar1[1] == '\0') {
      lVar3 = (long)ya_optind;
      iVar4 = ya_optind + 1;
      ya_optnext = (char *)0x0;
      if (pcVar2[2] == ':') {
        ya_optind = iVar4;
        ya_optarg = (char *)0x0;
        ya_optnext = (char *)0x0;
        return __c;
      }
      if (iVar4 != argc) {
        ya_optind = ya_optind + 2;
        ya_optarg = argv[lVar3 + 1];
        ya_optnext = (char *)0x0;
        return __c;
      }
      ya_optarg = (char *)0x0;
      ya_optind = iVar4;
      ya_optopt = __c;
      ya_getopt_error(optstring,"%s: option requires an argument -- \'%c\'\n",*argv,(ulong)__c);
      return (uint)(*optstring != ':') * 5 + 0x3a;
    }
    ya_optarg = pcVar1 + 1;
  }
  ya_optind = ya_optind + 1;
  ya_optnext = (char *)0x0;
  return __c;
}

Assistant:

static int ya_getopt_shortopts(int argc, char * const argv[], const char *optstring, int long_only)
{
    int opt = *ya_optnext;
    const char *os = strchr(optstring, opt);

    if (os == NULL) {
        ya_optarg = NULL;
        if (long_only) {
            ya_getopt_error(optstring, "%s: unrecognized option '-%s'\n", argv[0], ya_optnext);
            ya_optind++;
            ya_optnext = NULL;
        } else {
            ya_optopt = opt;
            ya_getopt_error(optstring, "%s: invalid option -- '%c'\n", argv[0], opt);
            if (*(++ya_optnext) == 0) {
                ya_optind++;
                ya_optnext = NULL;
            }
        }
        return '?';
    }
    if (os[1] == ':') {
        if (ya_optnext[1] == 0) {
            ya_optind++;
            ya_optnext = NULL;
            if (os[2] == ':') {
                /* optional argument */
                ya_optarg = NULL;
            } else {
                if (ya_optind == argc) {
                    ya_optarg = NULL;
                    ya_optopt = opt;
                    ya_getopt_error(optstring, "%s: option requires an argument -- '%c'\n", argv[0], opt);
                    if (optstring[0] == ':') {
                        return ':';
                    } else {
                        return '?';
                    }
                }
                ya_optarg = argv[ya_optind];
                ya_optind++;
            }
        } else {
            ya_optarg = ya_optnext + 1;
            ya_optind++;
        }
        ya_optnext = NULL;
    } else {
        ya_optarg = NULL;
        if (ya_optnext[1] == 0) {
            ya_optnext = NULL;
            ya_optind++;
        } else {
            ya_optnext++;
        }
    }
    return opt;
}